

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O2

void __thiscall QProcessPrivate::~QProcessPrivate(QProcessPrivate *this)

{
  QProcessPrivate *pQVar1;
  
  (this->super_QIODevicePrivate).super_QObjectPrivate.super_QObjectData._vptr_QObjectData =
       (_func_int **)&PTR__QProcessPrivate_0066a620;
  pQVar1 = (this->stdinChannel).process;
  if (pQVar1 != (QProcessPrivate *)0x0) {
    Channel::clear(&pQVar1->stdoutChannel);
  }
  pQVar1 = (this->stdoutChannel).process;
  if (pQVar1 != (QProcessPrivate *)0x0) {
    Channel::clear(&pQVar1->stdinChannel);
  }
  std::unique_ptr<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>::
  ~unique_ptr(&this->unixExtras);
  QProcessEnvironment::~QProcessEnvironment(&this->environment);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->workingDirectory).d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->arguments).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->program).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&this->stderrChannel);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&this->stdoutChannel);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&this->stdinChannel);
  QIODevicePrivate::~QIODevicePrivate(&this->super_QIODevicePrivate);
  return;
}

Assistant:

QProcessPrivate::~QProcessPrivate()
{
    if (stdinChannel.process)
        stdinChannel.process->stdoutChannel.clear();
    if (stdoutChannel.process)
        stdoutChannel.process->stdinChannel.clear();
}